

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::remove_duplicates
          (xpath_node_set_raw *this,xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  void *__s;
  long lVar3;
  xpath_node *pxVar4;
  ulong uVar5;
  xpath_node *pxVar6;
  xpath_node *pxVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar11;
  xml_node_struct *pxVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  xpath_allocator_capture cr;
  xpath_allocator_capture local_58;
  xml_node local_38;
  xpath_node_set_raw *pxVar10;
  
  if (this->_type == type_unsorted) {
    pxVar6 = this->_begin;
    pxVar4 = this->_end;
    uVar8 = (long)pxVar4 - (long)pxVar6;
    if (0x20 < (long)uVar8) {
      local_58._state._root = alloc->_root;
      local_58._state._root_size = alloc->_root_size;
      local_58._state._error = alloc->_error;
      uVar5 = 1;
      do {
        uVar11 = uVar5;
        uVar5 = uVar11 * 2;
      } while (uVar11 < (uVar8 >> 5) + (uVar8 >> 4));
      local_58._target = alloc;
      __s = xpath_allocator::allocate(alloc,uVar11 * 8);
      if (__s != (void *)0x0) {
        memset(__s,0,uVar11 * 8);
        pxVar6 = this->_begin;
        if (pxVar6 != this->_end) {
          uVar11 = uVar11 - 1;
          pxVar4 = pxVar6;
          do {
            pxVar12 = (xml_node_struct *)(pxVar4->_attribute)._attr;
            if (pxVar12 == (xml_node_struct *)0x0) {
              pxVar12 = (pxVar4->_node)._root;
              if (pxVar12 != (xml_node_struct *)0x0) goto LAB_00196f3e;
            }
            else {
              xml_node::xml_node(&local_38);
LAB_00196f3e:
              uVar9 = ((uint)((ulong)pxVar12 >> 0x10) & 0xffff ^ (uint)pxVar12) * -0x7a143595;
              uVar9 = (uVar9 >> 0xd ^ uVar9) * -0x3d4d51cb;
              uVar8 = (ulong)((uVar9 >> 0x10 ^ uVar9) & (uint)uVar11);
              uVar5 = 0;
              while (pxVar1 = *(xml_node_struct **)((long)__s + uVar8 * 8),
                    pxVar1 != (xml_node_struct *)0x0) {
                if (pxVar1 == pxVar12) goto LAB_00196f9d;
                lVar3 = uVar8 + uVar5;
                uVar5 = uVar5 + 1;
                uVar8 = lVar3 + 1U & uVar11;
                if (uVar11 < uVar5) {
                  __assert_fail("false && \"Hash table is full\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                                ,0x1d53,
                                "bool pugi::impl::(anonymous namespace)::hash_insert(const void **, size_t, const void *)"
                               );
                }
              }
              *(xml_node_struct **)((long)__s + uVar8 * 8) = pxVar12;
              pxVar2 = (pxVar4->_attribute)._attr;
              (pxVar6->_node)._root = (pxVar4->_node)._root;
              (pxVar6->_attribute)._attr = pxVar2;
              pxVar6 = pxVar6 + 1;
            }
LAB_00196f9d:
            pxVar4 = pxVar4 + 1;
          } while (pxVar4 != this->_end);
        }
        this->_end = pxVar6;
      }
      xpath_allocator_capture::~xpath_allocator_capture(&local_58);
      return;
    }
  }
  else {
    pxVar6 = this->_begin;
    pxVar4 = this->_end;
  }
  uVar8 = (long)pxVar4 - (long)pxVar6;
  pxVar10 = this;
  do {
    pxVar7 = pxVar6;
    pxVar6 = pxVar7 + 1;
    if ((long)uVar8 < 0x11) break;
    auVar15._0_4_ = -(uint)(*(int *)&(pxVar6->_node)._root == *(int *)&(pxVar7->_node)._root);
    auVar15._4_4_ =
         -(uint)(*(int *)((long)&pxVar7[1]._node._root + 4) ==
                *(int *)((long)&(pxVar7->_node)._root + 4));
    auVar15._8_4_ =
         -(uint)(*(int *)&pxVar7[1]._attribute._attr == *(int *)&(pxVar7->_attribute)._attr);
    auVar15._12_4_ =
         -(uint)(*(int *)((long)&pxVar7[1]._attribute._attr + 4) ==
                *(int *)((long)&(pxVar7->_attribute)._attr + 4));
    auVar13._4_4_ = auVar15._0_4_;
    auVar13._0_4_ = auVar15._4_4_;
    auVar13._8_4_ = auVar15._12_4_;
    auVar13._12_4_ = auVar15._8_4_;
    uVar9 = movmskpd((int)pxVar10,auVar13 & auVar15);
    pxVar10 = (xpath_node_set_raw *)(ulong)uVar9;
    uVar8 = uVar8 - 0x10;
  } while (uVar9 != 3);
  if (pxVar7 != pxVar4) {
    for (; pxVar6 != pxVar4; pxVar6 = pxVar6 + 1) {
      auVar16._0_4_ = -(uint)(*(int *)&(pxVar7->_node)._root == *(int *)&(pxVar6->_node)._root);
      auVar16._4_4_ =
           -(uint)(*(int *)((long)&(pxVar7->_node)._root + 4) ==
                  *(int *)((long)&(pxVar6->_node)._root + 4));
      auVar16._8_4_ =
           -(uint)(*(int *)&(pxVar7->_attribute)._attr == *(int *)&(pxVar6->_attribute)._attr);
      auVar16._12_4_ =
           -(uint)(*(int *)((long)&(pxVar7->_attribute)._attr + 4) ==
                  *(int *)((long)&(pxVar6->_attribute)._attr + 4));
      auVar14._4_4_ = auVar16._0_4_;
      auVar14._0_4_ = auVar16._4_4_;
      auVar14._8_4_ = auVar16._12_4_;
      auVar14._12_4_ = auVar16._8_4_;
      uVar9 = movmskpd((int)uVar8,auVar14 & auVar16);
      uVar8 = (ulong)uVar9;
      if (uVar9 != 3) {
        pxVar2 = (pxVar6->_attribute)._attr;
        pxVar7[1]._node._root = (pxVar6->_node)._root;
        pxVar7[1]._attribute._attr = pxVar2;
        pxVar7 = pxVar7 + 1;
      }
    }
    pxVar7 = pxVar7 + 1;
  }
  this->_end = pxVar7;
  return;
}

Assistant:

void remove_duplicates(xpath_allocator* alloc)
		{
			if (_type == xpath_node_set::type_unsorted && _end - _begin > 2)
			{
				xpath_allocator_capture cr(alloc);

				size_t size_ = static_cast<size_t>(_end - _begin);

				size_t hash_size = 1;
				while (hash_size < size_ + size_ / 2) hash_size *= 2;

				const void** hash_data = static_cast<const void**>(alloc->allocate(hash_size * sizeof(void**)));
				if (!hash_data) return;

				memset(hash_data, 0, hash_size * sizeof(const void**));

				xpath_node* write = _begin;

				for (xpath_node* it = _begin; it != _end; ++it)
				{
					const void* attr = it->attribute().internal_object();
					const void* node = it->node().internal_object();
					const void* key = attr ? attr : node;

					if (key && hash_insert(hash_data, hash_size, key))
					{
						*write++ = *it;
					}
				}

				_end = write;
			}
			else
			{
				_end = unique(_begin, _end);
			}
		}